

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

void __thiscall
flow_cutter::BasicCutter::
check_flow_conservation<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
          (BasicCutter *this,
          Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
          *graph)

{
  Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
  *graph_local;
  BasicCutter *this_local;
  
  return;
}

Assistant:

void check_flow_conservation(const Graph& graph)
    {
#ifndef NDEBUG
        for (int x = 0; x < graph.node_count(); ++x)
            if (!assimilated[source_side].is_inside(x) && !assimilated[target_side].is_inside(x)) {
                int flow_surplus = 0;
                for (auto xy : graph.out_arc(x))
                    flow_surplus += flow(xy);
                assert(flow_surplus == 0 && "Flow must be conserved outside of the assimilated sides");
            }
#endif
    }